

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libpopcnt.h
# Opt level: O0

uint64_t popcnt64_unrolled(uint64_t *data,uint64_t size)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t local_30;
  uint64_t cnt;
  uint64_t limit;
  uint64_t i;
  uint64_t size_local;
  uint64_t *data_local;
  
  local_30 = 0;
  for (limit = 0; limit < size - (size & 3); limit = limit + 4) {
    uVar1 = popcnt64(data[limit]);
    uVar2 = popcnt64(data[limit + 1]);
    uVar3 = popcnt64(data[limit + 2]);
    uVar4 = popcnt64(data[limit + 3]);
    local_30 = uVar4 + uVar3 + uVar2 + uVar1 + local_30;
  }
  for (; limit < size; limit = limit + 1) {
    uVar1 = popcnt64(data[limit]);
    local_30 = uVar1 + local_30;
  }
  return local_30;
}

Assistant:

static inline uint64_t popcnt64_unrolled(const uint64_t* data, uint64_t size)
{
  uint64_t i = 0;
  uint64_t limit = size - size % 4;
  uint64_t cnt = 0;

  for (; i < limit; i += 4)
  {
    cnt += popcnt64(data[i+0]);
    cnt += popcnt64(data[i+1]);
    cnt += popcnt64(data[i+2]);
    cnt += popcnt64(data[i+3]);
  }

  for (; i < size; i++)
    cnt += popcnt64(data[i]);

  return cnt;
}